

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMappedFile.cpp
# Opt level: O0

void __thiscall
aeron::util::MemoryMappedFile::MemoryMappedFile
          (MemoryMappedFile *this,FileHandle fd,off_t offset,size_t length)

{
  uint8_t *puVar1;
  long in_RCX;
  size_t in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  FileHandle unaff_retaddr;
  stat statInfo;
  stat64 local_b0;
  long local_20;
  undefined8 *length_00;
  undefined4 in_stack_fffffffffffffff8;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  local_20 = in_RCX;
  length_00 = in_RDI;
  if ((in_RCX == 0) && (in_RDX == 0)) {
    fstat64(in_ESI,&local_b0);
    local_20 = local_b0.st_size;
  }
  in_RDI[1] = local_20;
  puVar1 = doMapping((MemoryMappedFile *)CONCAT44(in_ESI,in_stack_fffffffffffffff8),
                     (size_t)length_00,unaff_retaddr,in_RDX);
  *in_RDI = puVar1;
  return;
}

Assistant:

MemoryMappedFile::MemoryMappedFile(FileHandle fd, off_t offset, size_t length)
{
    if (0 == length && 0 == offset)
    {
        struct stat statInfo;
        ::fstat(fd.handle, &statInfo);
        length = statInfo.st_size;
    }

    m_memorySize = length;
    m_memory = doMapping(m_memorySize, fd, offset);
}